

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateDefaultGlobalTargets(cmGlobalGenerator *this,cmTargets *targets)

{
  pointer *ppbVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  reference ppcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  string *psVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar9;
  mapped_type *pmVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  bool local_2e19;
  byte local_2d31;
  allocator local_28c1;
  key_type local_28c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28a0;
  allocator local_2881;
  string local_2880;
  cmTarget local_2860;
  cmCustomCommandLine *local_25e8;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_25e0;
  const_iterator local_25d8;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_25d0;
  const_iterator local_25c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_25c0;
  allocator local_25b1;
  value_type local_25b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2590;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2588;
  const_iterator local_2580;
  undefined1 local_2578 [8];
  cmCustomCommandLine stripCmdLine;
  string local_2558;
  char *local_2538;
  char *install_strip;
  key_type local_2528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2508;
  allocator local_24e9;
  string local_24e8;
  cmTarget local_24c8;
  cmCustomCommandLine *local_2250;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_2248;
  const_iterator local_2240;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_2238;
  const_iterator local_2230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2228;
  allocator local_2219;
  value_type local_2218;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21f0;
  const_iterator local_21e8;
  undefined1 local_21e0 [8];
  cmCustomCommandLine localCmdLine;
  char *install_local;
  key_type local_21b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2198;
  allocator local_2179;
  string local_2178;
  cmTarget local_2158;
  allocator local_1ed9;
  value_type local_1ed8;
  allocator local_1eb1;
  value_type local_1eb0;
  allocator local_1e89;
  string local_1e88;
  undefined1 local_1e62;
  allocator local_1e61;
  undefined1 local_1e60 [6];
  bool iosPlatform;
  string cfgArg;
  string local_1e38;
  allocator local_1e11;
  string local_1e10;
  allocator local_1de9;
  value_type local_1de8;
  allocator local_1dc1;
  string local_1dc0;
  char *local_1da0;
  char *noall;
  value_type local_1d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d68;
  const_iterator local_1d60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d58;
  const_iterator local_1d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d40;
  const_iterator local_1d38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d30;
  const_iterator local_1d28;
  cmCustomCommandLine *local_1d20;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_1d18;
  const_iterator local_1d10;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_1d08;
  const_iterator local_1d00;
  undefined1 local_1cf8 [8];
  string cmd;
  key_type local_1cd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1cb0;
  string local_1c98 [39];
  allocator local_1c71;
  string local_1c70;
  cmTarget local_1c50;
  value_type local_19d8;
  allocator local_19b1;
  string local_19b0;
  string local_1990;
  undefined1 local_1970 [8];
  ostringstream ostr;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_17f0;
  const_iterator local_17e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_17e0;
  const_iterator local_17d8;
  cmCustomCommandLine *local_17d0;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_17c8;
  const_iterator local_17c0;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_17b8;
  const_iterator local_17b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_17a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *componentsSet;
  string local_1798;
  allocator local_1771;
  string local_1770;
  undefined1 local_174a;
  allocator local_1749;
  undefined1 local_1748 [6];
  bool skipInstallRules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1728;
  allocator local_1709;
  string local_1708;
  cmTarget local_16e8;
  allocator local_1469;
  value_type local_1468;
  allocator local_1441;
  value_type local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1418;
  const_iterator local_1410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1408;
  const_iterator local_1400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13f0;
  const_iterator local_13e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13e0;
  const_iterator local_13d8;
  cmCustomCommandLine *local_13d0;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_13c8;
  const_iterator local_13c0;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_13b8;
  const_iterator local_13b0;
  char *local_13a8;
  char *rebuildCacheTargetName;
  key_type local_1398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1378;
  allocator local_1359;
  string local_1358;
  cmTarget local_1338;
  allocator local_10b9;
  value_type local_10b8;
  allocator local_1091;
  value_type local_1090;
  allocator local_1069;
  value_type local_1068;
  allocator local_1041;
  key_type local_1040;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1020;
  allocator local_1001;
  string local_1000;
  cmTarget local_fe0;
  allocator local_d61;
  value_type local_d60;
  allocator local_d39;
  value_type local_d38;
  undefined1 local_d18 [8];
  string edit_cmd;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf0;
  const_iterator local_ce8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ce0;
  const_iterator local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cc8;
  const_iterator local_cc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cb8;
  const_iterator local_cb0;
  cmCustomCommandLine *local_ca8;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_ca0;
  const_iterator local_c98;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_c90;
  const_iterator local_c88;
  char *local_c80;
  char *editCacheTargetName;
  key_type local_c70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c50;
  allocator local_c31;
  string local_c30;
  cmTarget local_c10;
  allocator local_991;
  value_type local_990;
  allocator local_969;
  value_type local_968;
  allocator local_941;
  value_type local_940;
  allocator local_919;
  value_type local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8f0;
  const_iterator local_8e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8e0;
  const_iterator local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8c8;
  const_iterator local_8c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8b8;
  const_iterator local_8b0;
  cmCustomCommandLine *local_8a8;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_8a0;
  const_iterator local_898;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_890;
  const_iterator local_888;
  allocator local_879;
  string local_878;
  allocator local_851;
  key_type local_850;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_830;
  allocator local_811;
  string local_810;
  cmTarget local_7f0;
  allocator local_571;
  value_type local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_548;
  const_iterator local_540;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538;
  const_iterator local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_520;
  const_iterator local_518;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_510;
  const_iterator local_508;
  cmCustomCommandLine *local_500;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_4f8;
  const_iterator local_4f0;
  __normal_iterator<cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
  local_4e8;
  const_iterator local_4e0;
  char *local_4d8;
  char *packageSourceTargetName;
  key_type local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  allocator local_489;
  string local_488;
  cmTarget local_468;
  allocator local_1e9;
  value_type local_1e8;
  allocator local_1c1;
  string local_1c0;
  char *local_1a0;
  char *noPackageAll;
  value_type local_190;
  allocator local_169;
  undefined1 local_168 [8];
  string relConfigFile;
  undefined1 local_140 [8];
  string configFile;
  value_type local_118;
  allocator local_f1;
  value_type local_f0;
  allocator local_c9;
  value_type local_c8;
  undefined1 local_a8 [8];
  cmCustomCommandLine singleLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines cpackCommandLines;
  allocator local_49;
  string local_48 [8];
  string workingDir;
  char *cmakeCfgIntDir;
  cmMakefile *mf;
  cmTargets *targets_local;
  cmGlobalGenerator *this_local;
  
  ppcVar6 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](&this->Makefiles,0)
  ;
  this_00 = *ppcVar6;
  iVar5 = (*this->_vptr_cmGlobalGenerator[0xd])();
  workingDir.field_2._8_8_ = CONCAT44(extraout_var,iVar5);
  pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar7,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cmCustomCommandLines::cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_a8);
  psVar8 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,psVar8);
  if (((workingDir.field_2._8_8_ != 0) && (*(char *)workingDir.field_2._8_8_ != '\0')) &&
     (*(char *)workingDir.field_2._8_8_ != '.')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"-C",&local_c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    uVar3 = workingDir.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,(char *)uVar3,&local_f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"--config",(allocator *)(configFile.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(configFile.field_2._M_local_buf + 0xf));
  pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,pcVar7,(allocator *)(relConfigFile.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(relConfigFile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=((string *)local_140,"/CPackConfig.cmake");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_168,"./CPackConfig.cmake",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,(value_type *)local_168);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])();
  if (CONCAT44(extraout_var_00,iVar5) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c0,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_1c1);
    pcVar7 = cmMakefile::GetDefinition(this_00,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    local_1a0 = pcVar7;
    if ((pcVar7 == (char *)0x0) || (bVar4 = cmSystemTools::IsOff(pcVar7), bVar4)) {
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x11])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,(char *)CONCAT44(extraout_var_02,iVar5),&local_1e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&singleLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
  }
  else {
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_190,(char *)CONCAT44(extraout_var_01,iVar5),
               (allocator *)((long)&noPackageAll + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&singleLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&noPackageAll + 7));
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  bVar4 = cmsys::SystemTools::FileExists(pcVar7);
  if (bVar4) {
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_488,(char *)CONCAT44(extraout_var_03,iVar5),&local_489);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    CreateGlobalTarget(&local_468,this,&local_488,"Run CPack packaging tool...",
                       (cmCustomCommandLines *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4a8,pcVar7,true);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4c8,(char *)CONCAT44(extraout_var_04,iVar5),
               (allocator *)((long)&packageSourceTargetName + 7));
    pmVar10 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
              ::operator[](targets,&local_4c8);
    cmTarget::operator=(pmVar10,&local_468);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&packageSourceTargetName + 7));
    cmTarget::~cmTarget(&local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4a8);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x18])();
  local_4d8 = (char *)CONCAT44(extraout_var_05,iVar5);
  if (local_4d8 != (char *)0x0) {
    ppbVar1 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4e8._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_4e0,&local_4e8);
    local_4f8._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_4f0,&local_4f8);
    local_500 = (cmCustomCommandLine *)
                std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                          ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                           ppbVar1,local_4e0,local_4f0);
    local_510._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_508,&local_510);
    local_520._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_518,&local_520);
    local_528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8,local_508,local_518);
    ppbVar1 = &singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_538._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_530,&local_538);
    local_548._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_540,&local_548);
    local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1,local_530,local_540);
    psVar8 = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,psVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_570,"--config",&local_571);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::operator=((string *)local_140,pcVar7);
    std::__cxx11::string::operator+=((string *)local_140,"/CPackSourceConfig.cmake");
    std::__cxx11::string::operator=((string *)local_168,"./CPackSourceConfig.cmake");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,(value_type *)local_168);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar4 = cmsys::SystemTools::FileExists(pcVar7);
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,(value_type *)local_140);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      pcVar7 = local_4d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_810,pcVar7,&local_811);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_830,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      CreateGlobalTarget(&local_7f0,this,&local_810,"Run CPack packaging tool for source...",
                         (cmCustomCommandLines *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_830,pcVar7,true)
      ;
      pcVar7 = local_4d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_850,pcVar7,&local_851);
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::operator[](targets,&local_850);
      cmTarget::operator=(pmVar10,&local_7f0);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator((allocator<char> *)&local_851);
      cmTarget::~cmTarget(&local_7f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_830);
      std::__cxx11::string::~string((string *)&local_810);
      std::allocator<char>::~allocator((allocator<char> *)&local_811);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_878,"CMAKE_TESTING_ENABLED",&local_879);
  bVar4 = cmMakefile::IsOn(this_00,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  if (bVar4) {
    ppbVar1 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_890._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_888,&local_890);
    local_8a0._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_898,&local_8a0);
    local_8a8 = (cmCustomCommandLine *)
                std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                          ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                           ppbVar1,local_888,local_898);
    local_8b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8b0,&local_8b8);
    local_8c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8c0,&local_8c8);
    local_8d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8,local_8b0,local_8c0);
    ppbVar1 = &singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_8e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8d8,&local_8e0);
    local_8f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_8e8,&local_8f0);
    local_8f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1,local_8d8,local_8e8);
    psVar8 = cmSystemTools::GetCTestCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,psVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_918,"--force-new-ctest-process",&local_919);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator((allocator<char> *)&local_919);
    if (((workingDir.field_2._8_8_ == 0) || (*(char *)workingDir.field_2._8_8_ == '\0')) ||
       (*(char *)workingDir.field_2._8_8_ == '.')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_990,"$(ARGS)",&local_991);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_990);
      std::__cxx11::string::~string((string *)&local_990);
      std::allocator<char>::~allocator((allocator<char> *)&local_991);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_940,"-C",&local_941);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_940);
      std::__cxx11::string::~string((string *)&local_940);
      std::allocator<char>::~allocator((allocator<char> *)&local_941);
      uVar3 = workingDir.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_968,(char *)uVar3,&local_969);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_968);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x16])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c30,(char *)CONCAT44(extraout_var_06,iVar5),&local_c31);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CreateGlobalTarget(&local_c10,this,&local_c30,"Running tests...",
                       (cmCustomCommandLines *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c50,(char *)0x0,
                       true);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x16])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c70,(char *)CONCAT44(extraout_var_07,iVar5),
               (allocator *)((long)&editCacheTargetName + 7));
    pmVar10 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
              ::operator[](targets,&local_c70);
    cmTarget::operator=(pmVar10,&local_c10);
    std::__cxx11::string::~string((string *)&local_c70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&editCacheTargetName + 7));
    cmTarget::~cmTarget(&local_c10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c50);
    std::__cxx11::string::~string((string *)&local_c30);
    std::allocator<char>::~allocator((allocator<char> *)&local_c31);
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x19])();
  local_c80 = (char *)CONCAT44(extraout_var_08,iVar5);
  if (local_c80 != (char *)0x0) {
    ppbVar1 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c90._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_c88,&local_c90);
    local_ca0._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_c98,&local_ca0);
    local_ca8 = (cmCustomCommandLine *)
                std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                          ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                           ppbVar1,local_c88,local_c98);
    local_cb8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_cb0,&local_cb8);
    local_cc8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_cc0,&local_cc8);
    local_cd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8,local_cb0,local_cc0);
    ppbVar1 = &singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_ce0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_cd8,&local_ce0);
    local_cf0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_ce8,&local_cf0);
    edit_cmd.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1,local_cd8,local_ce8);
    (*this->_vptr_cmGlobalGenerator[0x1c])(local_d18);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,(value_type *)local_d18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d38,"-H$(CMAKE_SOURCE_DIR)",&local_d39);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_d38);
      std::__cxx11::string::~string((string *)&local_d38);
      std::allocator<char>::~allocator((allocator<char> *)&local_d39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d60,"-B$(CMAKE_BINARY_DIR)",&local_d61);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_d60);
      std::__cxx11::string::~string((string *)&local_d60);
      std::allocator<char>::~allocator((allocator<char> *)&local_d61);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      pcVar7 = local_c80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1000,pcVar7,&local_1001);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1020,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      CreateGlobalTarget(&local_fe0,this,&local_1000,"Running CMake cache editor...",
                         (cmCustomCommandLines *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1020,(char *)0x0
                         ,true);
      pcVar7 = local_c80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1040,pcVar7,&local_1041);
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::operator[](targets,&local_1040);
      cmTarget::operator=(pmVar10,&local_fe0);
      std::__cxx11::string::~string((string *)&local_1040);
      std::allocator<char>::~allocator((allocator<char> *)&local_1041);
      cmTarget::~cmTarget(&local_fe0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1020);
      std::__cxx11::string::~string((string *)&local_1000);
      std::allocator<char>::~allocator((allocator<char> *)&local_1001);
    }
    else {
      psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,psVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1068,"-E",&local_1069);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_1068);
      std::__cxx11::string::~string((string *)&local_1068);
      std::allocator<char>::~allocator((allocator<char> *)&local_1069);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1090,"echo",&local_1091);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_1090);
      std::__cxx11::string::~string((string *)&local_1090);
      std::allocator<char>::~allocator((allocator<char> *)&local_1091);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_10b8,"No interactive CMake dialog available.",&local_10b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_10b8);
      std::__cxx11::string::~string((string *)&local_10b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      pcVar7 = local_c80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1358,pcVar7,&local_1359);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1378,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      CreateGlobalTarget(&local_1338,this,&local_1358,"No interactive CMake dialog available...",
                         (cmCustomCommandLines *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1378,(char *)0x0
                         ,false);
      pcVar7 = local_c80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1398,pcVar7,(allocator *)((long)&rebuildCacheTargetName + 7));
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::operator[](targets,&local_1398);
      cmTarget::operator=(pmVar10,&local_1338);
      std::__cxx11::string::~string((string *)&local_1398);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rebuildCacheTargetName + 7));
      cmTarget::~cmTarget(&local_1338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1378);
      std::__cxx11::string::~string((string *)&local_1358);
      std::allocator<char>::~allocator((allocator<char> *)&local_1359);
    }
    std::__cxx11::string::~string((string *)local_d18);
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x1a])();
  local_13a8 = (char *)CONCAT44(extraout_var_09,iVar5);
  if (local_13a8 != (char *)0x0) {
    ppbVar1 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_13b8._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_13b0,&local_13b8);
    local_13c8._M_current =
         (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                   ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
    ::__normal_iterator<cmCustomCommandLine*>
              ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                *)&local_13c0,&local_13c8);
    local_13d0 = (cmCustomCommandLine *)
                 std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                           ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                            ppbVar1,local_13b0,local_13c0);
    local_13e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_13d8,&local_13e0);
    local_13f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_13e8,&local_13f0);
    local_13f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8,local_13d8,local_13e8);
    ppbVar1 = &singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1408._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1400,&local_1408);
    local_1418._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1410,&local_1418);
    local_1420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)ppbVar1,local_1400,local_1410);
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,psVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1440,"-H$(CMAKE_SOURCE_DIR)",&local_1441);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_1440);
    std::__cxx11::string::~string((string *)&local_1440);
    std::allocator<char>::~allocator((allocator<char> *)&local_1441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1468,"-B$(CMAKE_BINARY_DIR)",&local_1469);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,&local_1468);
    std::__cxx11::string::~string((string *)&local_1468);
    std::allocator<char>::~allocator((allocator<char> *)&local_1469);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
    pcVar7 = local_13a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1708,pcVar7,&local_1709);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1728,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CreateGlobalTarget(&local_16e8,this,&local_1708,"Running CMake to regenerate build system...",
                       (cmCustomCommandLines *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1728,(char *)0x0,
                       true);
    pcVar7 = local_13a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1748,pcVar7,&local_1749);
    pmVar10 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
              ::operator[](targets,(key_type *)local_1748);
    cmTarget::operator=(pmVar10,&local_16e8);
    std::__cxx11::string::~string((string *)local_1748);
    std::allocator<char>::~allocator((allocator<char> *)&local_1749);
    cmTarget::~cmTarget(&local_16e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1728);
    std::__cxx11::string::~string((string *)&local_1708);
    std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1770,"CMAKE_SKIP_INSTALL_RULES",&local_1771);
  bVar4 = cmMakefile::IsOn(this_00,&local_1770);
  std::__cxx11::string::~string((string *)&local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  local_174a = bVar4;
  if (((this->InstallTargetEnabled & 1U) == 0) || (!bVar4)) {
    if (((this->InstallTargetEnabled & 1U) != 0) && (!bVar4)) {
      if ((workingDir.field_2._8_8_ == 0) ||
         ((*(char *)workingDir.field_2._8_8_ == '\0' || (*(char *)workingDir.field_2._8_8_ == '.')))
         ) {
        local_17a8 = &this->InstallComponents;
        ppbVar1 = &depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_17b8._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_17b0,&local_17b8);
        local_17c8._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_17c0,&local_17c8);
        local_17d0 = (cmCustomCommandLine *)
                     std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                               ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *
                                )ppbVar1,local_17b0,local_17c0);
        ppbVar1 = &singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_17e0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppbVar1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_17d8,&local_17e0);
        local_17f0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppbVar1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_17e8,&local_17f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar1,local_17d8,local_17e8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1970);
        bVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_17a8);
        if (bVar4) {
          std::operator<<((ostream *)local_1970,"Only default component available");
        }
        else {
          std::operator<<((ostream *)local_1970,"Available install components are: ");
          r = local_17a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_19b0," ",&local_19b1);
          cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_1990,'\"',r,'\"',&local_19b0);
          std::operator<<((ostream *)local_1970,(string *)&local_1990);
          std::__cxx11::string::~string((string *)&local_1990);
          std::__cxx11::string::~string((string *)&local_19b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_19b1);
        }
        std::__cxx11::ostringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8,&local_19d8);
        std::__cxx11::string::~string((string *)&local_19d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c70,"list_install_components",&local_1c71);
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1cb0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        CreateGlobalTarget(&local_1c50,this,&local_1c70,pcVar7,
                           (cmCustomCommandLines *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1cb0,
                           (char *)0x0,false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1cd0,"list_install_components",
                   (allocator *)(cmd.field_2._M_local_buf + 0xf));
        pmVar10 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  ::operator[](targets,&local_1cd0);
        cmTarget::operator=(pmVar10,&local_1c50);
        std::__cxx11::string::~string((string *)&local_1cd0);
        std::allocator<char>::~allocator((allocator<char> *)(cmd.field_2._M_local_buf + 0xf));
        cmTarget::~cmTarget(&local_1c50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1cb0);
        std::__cxx11::string::~string(local_1c98);
        std::__cxx11::string::~string((string *)&local_1c70);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1970);
      }
      psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::string((string *)local_1cf8,(string *)psVar8);
      ppbVar1 = &depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1d08._M_current =
           (cmCustomCommandLine *)
           std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                     ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
      ::__normal_iterator<cmCustomCommandLine*>
                ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                  *)&local_1d00,&local_1d08);
      local_1d18._M_current =
           (cmCustomCommandLine *)
           std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                     ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
      ::__normal_iterator<cmCustomCommandLine*>
                ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                  *)&local_1d10,&local_1d18);
      local_1d20 = (cmCustomCommandLine *)
                   std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                             ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                              ppbVar1,local_1d00,local_1d10);
      local_1d30._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1d28,&local_1d30);
      local_1d40._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1d38,&local_1d40);
      local_1d48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a8,local_1d28,local_1d38);
      ppbVar1 = &singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1d58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1d50,&local_1d58);
      local_1d68._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1d60,&local_1d68);
      local_1d70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)ppbVar1,local_1d50,local_1d60);
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])();
      if (CONCAT44(extraout_var_10,iVar5) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1dc0,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",&local_1dc1);
        pcVar7 = cmMakefile::GetDefinition(this_00,&local_1dc0);
        std::__cxx11::string::~string((string *)&local_1dc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1dc1);
        local_1da0 = pcVar7;
        if ((pcVar7 == (char *)0x0) || (bVar4 = cmSystemTools::IsOff(pcVar7), bVar4)) {
          iVar5 = (*this->_vptr_cmGlobalGenerator[0x11])();
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1de8,(char *)CONCAT44(extraout_var_12,iVar5),&local_1de9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&singleLine.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1de8);
          std::__cxx11::string::~string((string *)&local_1de8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1de9);
        }
      }
      else {
        iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1d90,(char *)CONCAT44(extraout_var_11,iVar5),
                   (allocator *)((long)&noall + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&singleLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d90);
        std::__cxx11::string::~string((string *)&local_1d90);
        std::allocator<char>::~allocator((allocator<char> *)((long)&noall + 7));
      }
      std::allocator<char>::allocator();
      cfgArg.field_2._M_local_buf[0xe] = '\0';
      cfgArg.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string((string *)&local_1e10,"CMake_BINARY_DIR",&local_1e11);
      pcVar7 = cmMakefile::GetDefinition(this_00,&local_1e10);
      local_2d31 = 0;
      if (pcVar7 != (char *)0x0) {
        std::allocator<char>::allocator();
        cfgArg.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_1e38,"CMAKE_CROSSCOMPILING",
                   (allocator *)(cfgArg.field_2._M_local_buf + 0xf));
        cfgArg.field_2._M_local_buf[0xd] = '\x01';
        bVar4 = cmMakefile::IsOn(this_00,&local_1e38);
        local_2d31 = bVar4 ^ 0xff;
      }
      if ((cfgArg.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_1e38);
      }
      if ((cfgArg.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(cfgArg.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)&local_1e10);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e11);
      if ((local_2d31 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_1cf8,"cmake");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,(value_type *)local_1cf8);
      if (((workingDir.field_2._8_8_ != 0) && (*(char *)workingDir.field_2._8_8_ != '\0')) &&
         (*(char *)workingDir.field_2._8_8_ != '.')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1e60,"-DBUILD_TYPE=",&local_1e61);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e61);
        local_1e62 = cmMakefile::PlatformIsAppleIos(this_00);
        if ((bool)local_1e62) {
          std::__cxx11::string::operator+=((string *)local_1e60,"$(CONFIGURATION)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a8,(value_type *)local_1e60);
          std::__cxx11::string::operator=
                    ((string *)local_1e60,"-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)");
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e88,"CMAKE_CFG_INTDIR",&local_1e89);
          pcVar7 = cmMakefile::GetDefinition(this_00,&local_1e88);
          std::__cxx11::string::operator+=((string *)local_1e60,pcVar7);
          std::__cxx11::string::~string((string *)&local_1e88);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8,(value_type *)local_1e60);
        std::__cxx11::string::~string((string *)local_1e60);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1eb0,"-P",&local_1eb1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_1eb0);
      std::__cxx11::string::~string((string *)&local_1eb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1ed8,"cmake_install.cmake",&local_1ed9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8,&local_1ed8);
      std::__cxx11::string::~string((string *)&local_1ed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x12])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2178,(char *)CONCAT44(extraout_var_13,iVar5),&local_2179);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2198,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      CreateGlobalTarget(&local_2158,this,&local_2178,"Install the project...",
                         (cmCustomCommandLines *)
                         &depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2198,(char *)0x0
                         ,true);
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x12])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_21b8,(char *)CONCAT44(extraout_var_14,iVar5),
                 (allocator *)((long)&install_local + 7));
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::operator[](targets,&local_21b8);
      cmTarget::operator=(pmVar10,&local_2158);
      std::__cxx11::string::~string((string *)&local_21b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&install_local + 7));
      cmTarget::~cmTarget(&local_2158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2198);
      std::__cxx11::string::~string((string *)&local_2178);
      std::allocator<char>::~allocator((allocator<char> *)&local_2179);
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x13])();
      localCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_15,iVar5);
      if (localCmdLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_21e0,(cmCustomCommandLine *)local_a8);
        local_21f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_21e0);
        local_21f0 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator+(&local_21f8,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_21e8,&local_21f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2218,"-DCMAKE_INSTALL_LOCAL_ONLY=1",&local_2219);
        local_2228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_21e0,local_21e8,&local_2218);
        std::__cxx11::string::~string((string *)&local_2218);
        std::allocator<char>::~allocator((allocator<char> *)&local_2219);
        ppbVar1 = &depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2238._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_2230,&local_2238);
        local_2248._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_2240,&local_2248);
        local_2250 = (cmCustomCommandLine *)
                     std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                               ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *
                                )ppbVar1,local_2230,local_2240);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_21e0);
        pbVar2 = localCmdLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_24e8,(char *)pbVar2,&local_24e9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_2508,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        CreateGlobalTarget(&local_24c8,this,&local_24e8,"Installing only the local directory...",
                           (cmCustomCommandLines *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2508,
                           (char *)0x0,true);
        pbVar2 = localCmdLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2528,(char *)pbVar2,(allocator *)((long)&install_strip + 7));
        pmVar10 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  ::operator[](targets,&local_2528);
        cmTarget::operator=(pmVar10,&local_24c8);
        std::__cxx11::string::~string((string *)&local_2528);
        std::allocator<char>::~allocator((allocator<char> *)((long)&install_strip + 7));
        cmTarget::~cmTarget(&local_24c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2508);
        std::__cxx11::string::~string((string *)&local_24e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_24e9);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_21e0);
      }
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x14])();
      local_2538 = (char *)CONCAT44(extraout_var_16,iVar5);
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      local_2e19 = false;
      if (local_2538 != (char *)0x0) {
        std::allocator<char>::allocator();
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_2558,"CMAKE_STRIP",
                   (allocator *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_2e19 = cmMakefile::IsSet(this_00,&local_2558);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2558);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if (local_2e19 != false) {
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_2578,(cmCustomCommandLine *)local_a8);
        local_2590._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2578);
        local_2588 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator+(&local_2590,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_2580,&local_2588);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_25b0,"-DCMAKE_INSTALL_DO_STRIP=1",&local_25b1)
        ;
        local_25c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2578,local_2580,&local_25b0);
        std::__cxx11::string::~string((string *)&local_25b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_25b1);
        ppbVar1 = &depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_25d0._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_25c8,&local_25d0);
        local_25e0._M_current =
             (cmCustomCommandLine *)
             std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                       ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)ppbVar1
                       );
        __gnu_cxx::
        __normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
        ::__normal_iterator<cmCustomCommandLine*>
                  ((__normal_iterator<cmCustomCommandLine_const*,std::vector<cmCustomCommandLine,std::allocator<cmCustomCommandLine>>>
                    *)&local_25d8,&local_25e0);
        local_25e8 = (cmCustomCommandLine *)
                     std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::erase
                               ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *
                                )ppbVar1,local_25c8,local_25d8);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2578);
        pcVar7 = local_2538;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2880,pcVar7,&local_2881);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_28a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        CreateGlobalTarget(&local_2860,this,&local_2880,"Installing the project stripped...",
                           (cmCustomCommandLines *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_28a0,
                           (char *)0x0,true);
        pcVar7 = local_2538;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_28c0,pcVar7,&local_28c1);
        pmVar10 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  ::operator[](targets,&local_28c0);
        cmTarget::operator=(pmVar10,&local_2860);
        std::__cxx11::string::~string((string *)&local_28c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
        cmTarget::~cmTarget(&local_2860);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_28a0);
        std::__cxx11::string::~string((string *)&local_2880);
        std::allocator<char>::~allocator((allocator<char> *)&local_2881);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_2578);
      }
      std::__cxx11::string::~string((string *)local_1cf8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1798,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,(allocator *)((long)&componentsSet + 7));
    cmMakefile::IssueMessage(this_00,WARNING,&local_1798,false);
    std::__cxx11::string::~string((string *)&local_1798);
    std::allocator<char>::~allocator((allocator<char> *)((long)&componentsSet + 7));
  }
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_140);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateDefaultGlobalTargets(cmTargets* targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();

  // CPack
  std::string workingDir =  mf->GetCurrentBinaryDirectory();
  cmCustomCommandLines cpackCommandLines;
  std::vector<std::string> depends;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if ( cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.' )
    {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
    }
  singleLine.push_back("--config");
  std::string configFile = mf->GetCurrentBinaryDirectory();;
  configFile += "/CPackConfig.cmake";
  std::string relConfigFile = "./CPackConfig.cmake";
  singleLine.push_back(relConfigFile);
  cpackCommandLines.push_back(singleLine);
  if ( this->GetPreinstallTargetName() )
    {
    depends.push_back(this->GetPreinstallTargetName());
    }
  else
    {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if(!noPackageAll || cmSystemTools::IsOff(noPackageAll))
      {
      depends.push_back(this->GetAllTargetName());
      }
    }
  if(cmSystemTools::FileExists(configFile.c_str()))
    {
    (*targets)[this->GetPackageTargetName()]
      = this->CreateGlobalTarget(this->GetPackageTargetName(),
                                 "Run CPack packaging tool...",
                                 &cpackCommandLines, depends,
                                 workingDir.c_str(), /*uses_terminal*/true);
    }
  // CPack source
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if ( packageSourceTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCPackCommand());
    singleLine.push_back("--config");
    configFile = mf->GetCurrentBinaryDirectory();;
    configFile += "/CPackSourceConfig.cmake";
    relConfigFile = "./CPackSourceConfig.cmake";
    singleLine.push_back(relConfigFile);
    if(cmSystemTools::FileExists(configFile.c_str()))
      {
      singleLine.push_back(configFile);
      cpackCommandLines.push_back(singleLine);
      (*targets)[packageSourceTargetName]
        = this->CreateGlobalTarget(packageSourceTargetName,
                                   "Run CPack packaging tool for source...",
                                   &cpackCommandLines, depends,
                                   workingDir.c_str(), /*uses_terminal*/true);
      }
    }

  // Test
  if(mf->IsOn("CMAKE_TESTING_ENABLED"))
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCTestCommand());
    singleLine.push_back("--force-new-ctest-process");
    if(cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.')
      {
      singleLine.push_back("-C");
      singleLine.push_back(cmakeCfgIntDir);
      }
    else // TODO: This is a hack. Should be something to do with the generator
      {
      singleLine.push_back("$(ARGS)");
      }
    cpackCommandLines.push_back(singleLine);
    (*targets)[this->GetTestTargetName()]
      = this->CreateGlobalTarget(this->GetTestTargetName(),
        "Running tests...", &cpackCommandLines, depends, 0,
        /*uses_terminal*/true);
    }

  //Edit Cache
  const char* editCacheTargetName = this->GetEditCacheTargetName();
  if ( editCacheTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());

    // Use generator preference for the edit_cache rule if it is defined.
    std::string edit_cmd = this->GetEditCacheCommand();
    if (!edit_cmd.empty())
      {
      singleLine.push_back(edit_cmd);
      singleLine.push_back("-H$(CMAKE_SOURCE_DIR)");
      singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
      cpackCommandLines.push_back(singleLine);
      (*targets)[editCacheTargetName] =
        this->CreateGlobalTarget(
          editCacheTargetName, "Running CMake cache editor...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }
    else
      {
      singleLine.push_back(cmSystemTools::GetCMakeCommand());
      singleLine.push_back("-E");
      singleLine.push_back("echo");
      singleLine.push_back("No interactive CMake dialog available.");
      cpackCommandLines.push_back(singleLine);
      (*targets)[editCacheTargetName] =
        this->CreateGlobalTarget(
          editCacheTargetName,
          "No interactive CMake dialog available...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/false);
      }
    }

  //Rebuild Cache
  const char* rebuildCacheTargetName = this->GetRebuildCacheTargetName();
  if ( rebuildCacheTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCMakeCommand());
    singleLine.push_back("-H$(CMAKE_SOURCE_DIR)");
    singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
    cpackCommandLines.push_back(singleLine);
    (*targets)[rebuildCacheTargetName] =
      this->CreateGlobalTarget(
        rebuildCacheTargetName, "Running CMake to regenerate build system...",
        &cpackCommandLines, depends, 0, /*uses_terminal*/true);
    }

  //Install
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if(this->InstallTargetEnabled && skipInstallRules)
    {
    mf->IssueMessage(cmake::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified");
    }
  else if(this->InstallTargetEnabled && !skipInstallRules)
    {
    if(!cmakeCfgIntDir || !*cmakeCfgIntDir || cmakeCfgIntDir[0] == '.')
      {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      cpackCommandLines.erase(cpackCommandLines.begin(),
        cpackCommandLines.end());
      depends.erase(depends.begin(), depends.end());
      std::ostringstream ostr;
      if (!componentsSet->empty())
        {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
        }
      else
        {
        ostr << "Only default component available";
        }
      singleLine.push_back(ostr.str());
      (*targets)["list_install_components"]
        = this->CreateGlobalTarget("list_install_components",
          ostr.str().c_str(),
          &cpackCommandLines, depends, 0, /*uses_terminal*/false);
      }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    cpackCommandLines.erase(cpackCommandLines.begin(),
      cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    if ( this->GetPreinstallTargetName() )
      {
      depends.push_back(this->GetPreinstallTargetName());
      }
    else
      {
      const char* noall =
        mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if(!noall || cmSystemTools::IsOff(noall))
        {
        depends.push_back(this->GetAllTargetName());
        }
      }
    if(mf->GetDefinition("CMake_BINARY_DIR") &&
       !mf->IsOn("CMAKE_CROSSCOMPILING"))
      {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
      }
    singleLine.push_back(cmd);
    if ( cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.' )
      {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool iosPlatform = mf->PlatformIsAppleIos();
      if(iosPlatform)
        {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
        }
      else
        {
        cfgArg += mf->GetDefinition("CMAKE_CFG_INTDIR");
        }
      singleLine.push_back(cfgArg);
      }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    cpackCommandLines.push_back(singleLine);
    (*targets)[this->GetInstallTargetName()] =
      this->CreateGlobalTarget(
        this->GetInstallTargetName(), "Install the project...",
        &cpackCommandLines, depends, 0, /*uses_terminal*/true);

    // install_local
    if(const char* install_local = this->GetInstallLocalTargetName())
      {
      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin()+1,
                                               "-DCMAKE_INSTALL_LOCAL_ONLY=1");
      cpackCommandLines.erase(cpackCommandLines.begin(),
                                                      cpackCommandLines.end());
      cpackCommandLines.push_back(localCmdLine);

      (*targets)[install_local] =
        this->CreateGlobalTarget(
          install_local, "Installing only the local directory...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if((install_strip !=0) && (mf->IsSet("CMAKE_STRIP")))
      {
      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin()+1,"-DCMAKE_INSTALL_DO_STRIP=1");
      cpackCommandLines.erase(cpackCommandLines.begin(),
        cpackCommandLines.end());
      cpackCommandLines.push_back(stripCmdLine);

      (*targets)[install_strip] =
        this->CreateGlobalTarget(
          install_strip, "Installing the project stripped...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }
    }
}